

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.h
# Opt level: O2

void __thiscall vm_val_t::num_to_logical(vm_val_t *this)

{
  if (this->typ == VM_INT) {
    this->typ = VM_TRUE - ((this->val).obj == 0);
    return;
  }
  err_throw(0x7d6);
}

Assistant:

void num_to_logical()
    {
        /* check the type */
        if (typ == VM_INT)
        {
            /* it's an integer - treat 0 as nil, all else as true */
            typ = (val.intval == 0 ? VM_NIL : VM_TRUE);
        }
        else
        {
            /* it's not a number - throw an error */
            err_throw(VMERR_NO_LOG_CONV);
        }
    }